

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::ServiceOptions::ServiceOptions(ServiceOptions *this,ServiceOptions *from)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ExtensionSet *in_RSI;
  undefined8 *in_RDI;
  Arena *in_stack_ffffffffffffff58;
  Container *in_stack_ffffffffffffff60;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *in_stack_ffffffffffffff68;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *in_stack_ffffffffffffff70;
  ExtensionSet *in_stack_ffffffffffffffa8;
  ExtensionSet *in_stack_ffffffffffffffc0;
  Container *local_20;
  
  Message::Message((Message *)in_stack_ffffffffffffff60);
  *in_RDI = &PTR__ServiceOptions_00958e70;
  internal::ExtensionSet::ExtensionSet(in_stack_ffffffffffffffc0);
  internal::InternalMetadataWithArena::InternalMetadataWithArena
            ((InternalMetadataWithArena *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  *(undefined4 *)(in_RDI + 5) = *(undefined4 *)&in_RSI[1].map_;
  internal::CachedSize::CachedSize((CachedSize *)0x520801);
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  uVar1._0_2_ = in_RSI[1].flat_capacity_;
  uVar1._2_2_ = in_RSI[1].flat_size_;
  uVar1._4_4_ = *(undefined4 *)&in_RSI[1].field_0xc;
  if (((uint)uVar1 & 1) == 1) {
    uVar2._0_2_ = in_RSI[1].flat_capacity_;
    uVar2._2_2_ = in_RSI[1].flat_size_;
    uVar2._4_4_ = *(undefined4 *)&in_RSI[1].field_0xc;
    if (((uint)uVar2 & 1) == 1) {
      local_20 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)&in_RSI[1].flat_capacity_);
    }
    else {
      in_stack_ffffffffffffff60 =
           (Container *)internal::InternalMetadataWithArena::default_instance();
      local_20 = in_stack_ffffffffffffff60;
    }
    internal::InternalMetadataWithArena::DoMergeFrom
              ((InternalMetadataWithArena *)in_stack_ffffffffffffff60,&local_20->unknown_fields);
  }
  internal::ExtensionSet::MergeFrom(in_RSI,in_stack_ffffffffffffffa8);
  *(byte *)(in_RDI + 9) = *(byte *)&in_RSI[3].arena_ & 1;
  return;
}

Assistant:

ServiceOptions::ServiceOptions(const ServiceOptions& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      _internal_metadata_(nullptr),
      _has_bits_(from._has_bits_),
      uninterpreted_option_(from.uninterpreted_option_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  deprecated_ = from.deprecated_;
  // @@protoc_insertion_point(copy_constructor:google.protobuf.ServiceOptions)
}